

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.cpp
# Opt level: O0

uint64_t murmurhash(void *key,uint64_t len,uint64_t seed)

{
  ulong uVar1;
  ulong in_RDX;
  ulong in_RSI;
  byte *in_RDI;
  long in_FS_OFFSET;
  size_t k_1;
  uchar *end;
  uchar *data;
  uint64_t h;
  int r;
  uint64_t m;
  uint64_t k;
  ulong local_58;
  byte *local_48;
  ulong local_40;
  
  local_40 = in_RDX ^ in_RSI * -0x395b586ca42e166b;
  for (local_48 = in_RDI; local_48 != in_RDI + (in_RSI & 0xfffffffffffffff8);
      local_48 = local_48 + 8) {
    local_40 = (((ulong)(*(long *)local_48 * -0x395b586ca42e166b) >> 0x2f ^
                *(long *)local_48 * -0x395b586ca42e166b) * -0x395b586ca42e166b ^ local_40) *
               -0x395b586ca42e166b;
  }
  if ((in_RSI & 7) != 0) {
    local_58 = 0;
    for (; local_48 != in_RDI + (in_RSI & 0xfffffffffffffff8) + (in_RSI & 7);
        local_48 = local_48 + 1) {
      local_58 = (ulong)*local_48 | local_58 << 8;
    }
    local_40 = (local_58 ^ local_40) * -0x395b586ca42e166b;
  }
  uVar1 = (local_40 ^ local_40 >> 0x2f) * -0x395b586ca42e166b;
  if (*(long *)(in_FS_OFFSET + 0x28) == *(long *)(in_FS_OFFSET + 0x28)) {
    return uVar1 ^ uVar1 >> 0x2f;
  }
  __stack_chk_fail();
}

Assistant:

inline uint64_t murmurhash(const void *key, uint64_t len, uint64_t seed) noexcept
{
    const uint64_t m = 0xc6a4a7935bd1e995ULL;
    const int r = 47;

    uint64_t h = seed ^ (len * m);

    const unsigned char *data = reinterpret_cast<const unsigned char *>(key);
    const unsigned char *end = data + (len & ~7ul);

    while (data != end) {
        uint64_t k;
        memcpy(&k, data, sizeof(uint64_t));

        k *= m;
        k ^= k >> r;
        k *= m;

        h ^= k;
        h *= m;

        data += 8;
    }

    len &= 7;
    if (len) {
        // handle the last few bytes of input
        size_t k = 0;
        end += len;

        while (data != end) {
            k <<= 8;
            k |= *data;
            ++data;
        }
        h ^= k;
        h *= m;
    }

    h ^= h >> r;
    h *= m;
    h ^= h >> r;

    return h;
}